

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

bool tinyusdz::is_close(matrix4f *a,matrix4f *b,float eps)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = a->m[0][0];
  fVar1 = b->m[0][0];
  fVar4 = ABS(fVar3 - fVar1);
  if (fVar4 <= eps) {
LAB_001f6f9f:
    fVar3 = a->m[0][1];
    fVar1 = b->m[0][1];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[0][2];
    fVar1 = b->m[0][2];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[0][3];
    fVar1 = b->m[0][3];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[1][0];
    fVar1 = b->m[1][0];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[1][1];
    fVar1 = b->m[1][1];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[1][2];
    fVar1 = b->m[1][2];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[1][3];
    fVar1 = b->m[1][3];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[2][0];
    fVar1 = b->m[2][0];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[2][1];
    fVar1 = b->m[2][1];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[2][2];
    fVar1 = b->m[2][2];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[2][3];
    fVar1 = b->m[2][3];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[3][0];
    fVar1 = b->m[3][0];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[3][1];
    fVar1 = b->m[3][1];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[3][2];
    fVar1 = b->m[3][2];
    fVar4 = ABS(fVar3 - fVar1);
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      if (fVar3 * eps < fVar4) goto LAB_001f73a3;
    }
    fVar3 = a->m[3][3];
    fVar1 = b->m[3][3];
    fVar4 = ABS(fVar3 - fVar1);
    bVar2 = true;
    if (eps < fVar4) {
      fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
      bVar2 = fVar4 <= fVar3 * eps;
    }
  }
  else {
    fVar3 = fmaxf(ABS(fVar3),ABS(fVar1));
    if (fVar4 <= fVar3 * eps) goto LAB_001f6f9f;
LAB_001f73a3:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_close(const value::matrix4f &a, const value::matrix4f &b, const float eps) {
  return math::is_close(a.m[0][0], b.m[0][0], eps) &&
         math::is_close(a.m[0][1], b.m[0][1], eps) &&
         math::is_close(a.m[0][2], b.m[0][2], eps) &&
         math::is_close(a.m[0][3], b.m[0][3], eps) &&
         math::is_close(a.m[1][0], b.m[1][0], eps) &&
         math::is_close(a.m[1][1], b.m[1][1], eps) &&
         math::is_close(a.m[1][2], b.m[1][2], eps) &&
         math::is_close(a.m[1][3], b.m[1][3], eps) &&
         math::is_close(a.m[2][0], b.m[2][0], eps) &&
         math::is_close(a.m[2][1], b.m[2][1], eps) &&
         math::is_close(a.m[2][2], b.m[2][2], eps) &&
         math::is_close(a.m[2][3], b.m[2][3], eps) &&
         math::is_close(a.m[3][0], b.m[3][0], eps) &&
         math::is_close(a.m[3][1], b.m[3][1], eps) &&
         math::is_close(a.m[3][2], b.m[3][2], eps) &&
         math::is_close(a.m[3][3], b.m[3][3], eps);
}